

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O3

char * ysimple_name(obj *obj)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *__src;
  
  iVar1 = nextobuf_bufidx + 1 >> 0x1f;
  nextobuf_bufidx =
       nextobuf_bufidx + (((uint)((nextobuf_bufidx + 1) / 6 + iVar1) >> 1) - iVar1) * -0xc + 1;
  pcVar2 = shk_your(nextobuf_bufs + (long)nextobuf_bufidx * 0x100,obj);
  sVar3 = strlen(pcVar2);
  sVar4 = strlen(pcVar2);
  (pcVar2 + sVar4)[0] = ' ';
  (pcVar2 + sVar4)[1] = '\0';
  __src = simple_typename((int)obj->otyp);
  pcVar2 = strncat(pcVar2,__src,(long)(0xfe - (int)sVar3));
  return pcVar2;
}

Assistant:

char *ysimple_name(const struct obj *obj)
{
	char *outbuf = nextobuf();
	char *s = shk_your(outbuf, obj);	/* assert( s == outbuf ); */
	int space_left = BUFSZ - strlen(s) - sizeof " ";

	return strncat(strcat(s, " "), simple_typename(obj->otyp), space_left);
}